

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O3

bool rsg::anon_unknown_13::
     compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
               (ConstValueRangeAccess *a,ConstValueRangeAccess *b)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  Type TVar4;
  VariableType *pVVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  ConstValueRangeAccess local_78;
  ConstValueRangeAccess local_60;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  
  pVVar5 = a->m_type;
  TVar4 = pVVar5->m_baseType;
  if (TVar4 == TYPE_ARRAY) {
    iVar7 = pVVar5->m_numElements;
    if (0 < iVar7) {
      iVar9 = 0;
      do {
        iVar8 = VariableType::getElementScalarOffset(a->m_type,iVar9);
        local_60.m_type = VariableType::getElementType(a->m_type);
        local_60.m_min = a->m_min + iVar8;
        local_60.m_max = a->m_max + iVar8;
        iVar8 = VariableType::getElementScalarOffset(b->m_type,iVar9);
        local_78.m_type = VariableType::getElementType(b->m_type);
        local_78.m_min = b->m_min + iVar8;
        local_78.m_max = b->m_max + iVar8;
        bVar6 = compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
                          (&local_60,&local_78);
        if (!(bool)bVar6) break;
        bVar14 = iVar7 + -1 != iVar9;
        iVar9 = iVar9 + 1;
      } while (bVar14);
      goto switchD_0013ba7e_caseD_4;
    }
  }
  else if (TVar4 == TYPE_STRUCT) {
    uVar12 = (int)((long)(pVVar5->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pVVar5->m_members).
                         super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x33333333;
    if (0 < (int)uVar12) {
      lVar10 = 0;
      lVar11 = 0;
      do {
        iVar7 = VariableType::getMemberScalarOffset(a->m_type,(int)lVar11);
        local_60.m_type =
             *(VariableType **)
              ((long)&((a->m_type->m_members).
                       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar10);
        local_60.m_min = a->m_min + iVar7;
        local_60.m_max = a->m_max + iVar7;
        iVar7 = VariableType::getMemberScalarOffset(b->m_type,(int)lVar11);
        local_78.m_min = b->m_min + iVar7;
        local_78.m_max = b->m_max + iVar7;
        local_78.m_type =
             *(VariableType **)
              ((long)&((b->m_type->m_members).
                       super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar10);
        bVar6 = compareValueRangesAllTrue<rsg::(anonymous_namespace)::CompareIntersection>
                          (&local_60,&local_78);
        if (!(bool)bVar6) break;
        lVar10 = lVar10 + 0x28;
        bVar14 = (ulong)(uVar12 & 0x7fffffff) - 1 != lVar11;
        lVar11 = lVar11 + 1;
      } while (bVar14);
      goto switchD_0013ba7e_caseD_4;
    }
  }
  else {
    bVar6 = 0;
    if (6 < TVar4 - TYPE_FLOAT) goto switchD_0013ba7e_caseD_4;
    uVar12 = pVVar5->m_numElements;
    uVar13 = (ulong)uVar12;
    switch(TVar4) {
    case TYPE_FLOAT:
      if (0 < (int)uVar12) {
        lVar11 = 0;
        do {
          VariableType::getElementType(a->m_type);
          fVar1 = a->m_min[lVar11].floatVal;
          VariableType::getElementType(a->m_type);
          _local_48 = ZEXT416((uint)a->m_max[lVar11].intVal);
          VariableType::getElementType(b->m_type);
          local_48._4_4_ = -(uint)(0.0 <= (float)local_48._4_4_);
          local_48._0_4_ = -(uint)(b->m_min[lVar11].floatVal <= (float)local_48._0_4_);
          fStack_40 = (float)-(uint)(0.0 <= fStack_40);
          fStack_3c = (float)-(uint)(0.0 <= fStack_3c);
          VariableType::getElementType(b->m_type);
          uVar12 = -(uint)(fVar1 <= b->m_max[lVar11].floatVal) & local_48._0_4_;
          bVar6 = (byte)uVar12;
          if ((uVar12 & 1) == 0) break;
          bVar14 = uVar13 - 1 != lVar11;
          lVar11 = lVar11 + 1;
        } while (bVar14);
        goto switchD_0013ba7e_caseD_4;
      }
      break;
    default:
      if (0 < (int)uVar12) {
        lVar11 = 0;
        do {
          VariableType::getElementType(a->m_type);
          iVar7 = a->m_min[lVar11].intVal;
          VariableType::getElementType(a->m_type);
          iVar9 = a->m_max[lVar11].intVal;
          VariableType::getElementType(b->m_type);
          iVar8 = b->m_min[lVar11].intVal;
          VariableType::getElementType(b->m_type);
          bVar6 = iVar8 <= iVar9 && iVar7 <= b->m_max[lVar11].intVal;
          if (iVar9 < iVar8 || b->m_max[lVar11].intVal < iVar7) break;
          bVar14 = uVar13 - 1 != lVar11;
          lVar11 = lVar11 + 1;
        } while (bVar14);
        goto switchD_0013ba7e_caseD_4;
      }
      break;
    case TYPE_BOOL:
      if (0 < (int)uVar12) {
        lVar11 = 0;
        do {
          VariableType::getElementType(a->m_type);
          bVar14 = a->m_min[lVar11].boolVal;
          VariableType::getElementType(a->m_type);
          bVar2 = a->m_max[lVar11].boolVal;
          VariableType::getElementType(b->m_type);
          bVar3 = b->m_min[lVar11].boolVal;
          VariableType::getElementType(b->m_type);
          bVar6 = (bVar3 ^ 1U | bVar2) & (bVar14 ^ 1U | b->m_max[lVar11].boolVal);
          if (bVar6 != 1) break;
          bVar14 = uVar13 - 1 != lVar11;
          lVar11 = lVar11 + 1;
        } while (bVar14);
        goto switchD_0013ba7e_caseD_4;
      }
      break;
    case TYPE_STRUCT:
    case TYPE_ARRAY:
      goto switchD_0013ba7e_caseD_4;
    }
  }
  bVar6 = 1;
switchD_0013ba7e_caseD_4:
  return (bool)(bVar6 & 1);
}

Assistant:

bool compareValueRangesAllTrue (const ConstValueRangeAccess& a, const ConstValueRangeAccess& b)
{
	DE_ASSERT(a.getType() == b.getType());

	if (a.getType().isStruct())
	{
		int numMembers = (int)a.getType().getMembers().size();
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			if (!compareValueRangesAllTrue<CompareOp>(a.member(ndx), b.member(ndx)))
				return false;
		}
	}
	else if (a.getType().isArray())
	{
		int numElements = (int)a.getType().getNumElements();
		for (int ndx = 0; ndx < numElements; ndx++)
		{
			if (!compareValueRangesAllTrue<CompareOp>(a.arrayElement(ndx), b.arrayElement(ndx)))
				return false;
		}
	}
	else
	{
		int numElements = (int)a.getType().getNumElements();
		switch (a.getType().getBaseType())
		{
			case VariableType::TYPE_FLOAT:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					float aMin = a.component(ndx).getMin().asFloat();
					float aMax = a.component(ndx).getMax().asFloat();
					float bMin = b.component(ndx).getMin().asFloat();
					float bMax = b.component(ndx).getMax().asFloat();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			case VariableType::TYPE_INT:
			case VariableType::TYPE_SAMPLER_2D:
			case VariableType::TYPE_SAMPLER_CUBE:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					int aMin = a.component(ndx).getMin().asInt();
					int aMax = a.component(ndx).getMax().asInt();
					int bMin = b.component(ndx).getMin().asInt();
					int bMax = b.component(ndx).getMax().asInt();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			case VariableType::TYPE_BOOL:
				for (int ndx = 0; ndx < numElements; ndx++)
				{
					bool aMin = a.component(ndx).getMin().asBool();
					bool aMax = a.component(ndx).getMax().asBool();
					bool bMin = b.component(ndx).getMin().asBool();
					bool bMax = b.component(ndx).getMax().asBool();

					if (!CompareOp()(aMin, aMax, bMin, bMax))
						return false;
				}
				break;

			default:
				DE_ASSERT(DE_FALSE);
				return false;
		}
	}

	return true;
}